

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int TestXmmRptrEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                       _func_int_uchar_ptr_x86XmmReg_x86Size_x86Reg_int_x86Reg_int *fun,
                       uint testSize)

{
  x86XmmReg xVar1;
  x86Reg xVar2;
  x86Reg xVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uchar *puVar8;
  long local_50;
  int local_38;
  
  local_50 = 0;
  puVar8 = stream;
  do {
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        if ((testSize & 1) != 0) {
          if (lVar7 != 0) {
            xVar1 = testXmmRegs[local_50];
            xVar2 = testIndexRegs[lVar6];
            xVar3 = *(x86Reg *)((long)testBaseRegs + lVar7);
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sDWORD,xVar2,1,xVar3,0);
            iVar4 = (*fun)(puVar8,xVar1,sDWORD,xVar2,1,xVar3,0);
            puVar8 = puVar8 + iVar4;
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sDWORD,xVar2,1,xVar3,4);
            iVar4 = (*fun)(puVar8,xVar1,sDWORD,xVar2,1,xVar3,4);
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sDWORD,xVar2,1,xVar3,0x400);
            iVar5 = (*fun)(puVar8 + iVar4,xVar1,sDWORD,xVar2,1,xVar3,0x400);
            puVar8 = puVar8 + iVar4 + iVar5;
          }
          if (lVar6 != 0) {
            xVar2 = testIndexRegs[lVar6];
            xVar1 = testXmmRegs[local_50];
            xVar3 = *(x86Reg *)((long)testBaseRegs + lVar7);
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sDWORD,xVar2,2,xVar3,0);
            iVar4 = (*fun)(puVar8,xVar1,sDWORD,xVar2,2,xVar3,0);
            puVar8 = puVar8 + iVar4;
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sDWORD,xVar2,2,xVar3,4);
            iVar4 = (*fun)(puVar8,xVar1,sDWORD,xVar2,2,xVar3,4);
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sDWORD,xVar2,2,xVar3,0x400);
            iVar5 = (*fun)(puVar8 + iVar4,xVar1,sDWORD,xVar2,2,xVar3,0x400);
            puVar8 = puVar8 + iVar4 + iVar5;
          }
        }
        if ((testSize & 2) != 0) {
          if (lVar7 != 0) {
            xVar1 = testXmmRegs[local_50];
            xVar2 = testIndexRegs[lVar6];
            xVar3 = *(x86Reg *)((long)testBaseRegs + lVar7);
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sQWORD,xVar2,1,xVar3,0);
            iVar4 = (*fun)(puVar8,xVar1,sQWORD,xVar2,1,xVar3,0);
            puVar8 = puVar8 + iVar4;
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sQWORD,xVar2,1,xVar3,4);
            iVar4 = (*fun)(puVar8,xVar1,sQWORD,xVar2,1,xVar3,4);
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sQWORD,xVar2,1,xVar3,0x400);
            iVar5 = (*fun)(puVar8 + iVar4,xVar1,sQWORD,xVar2,1,xVar3,0x400);
            puVar8 = puVar8 + iVar4 + iVar5;
          }
          if (lVar6 != 0) {
            xVar2 = testIndexRegs[lVar6];
            xVar1 = testXmmRegs[local_50];
            xVar3 = *(x86Reg *)((long)testBaseRegs + lVar7);
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sQWORD,xVar2,2,xVar3,0);
            iVar4 = (*fun)(puVar8,xVar1,sQWORD,xVar2,2,xVar3,0);
            puVar8 = puVar8 + iVar4;
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sQWORD,xVar2,2,xVar3,4);
            iVar4 = (*fun)(puVar8,xVar1,sQWORD,xVar2,2,xVar3,4);
            EMIT_OP_REG_RPTR(ctx,op,xVar1,sQWORD,xVar2,2,xVar3,0x400);
            iVar5 = (*fun)(puVar8 + iVar4,xVar1,sQWORD,xVar2,2,xVar3,0x400);
            puVar8 = puVar8 + iVar4 + iVar5;
          }
        }
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x28);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 9);
    local_50 = local_50 + 1;
  } while (local_50 != 6);
  local_38 = (int)stream;
  return (int)puVar8 - local_38;
}

Assistant:

int TestXmmRptrEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86XmmReg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift), unsigned testSize = testSizeDword | testSizeQword)
{
	unsigned char *start = stream;

	for(unsigned xmm = 0; xmm < sizeof(testXmmRegs) / sizeof(testXmmRegs[0]); xmm++)
	{
		for(unsigned index = 0; index < sizeof(testIndexRegs) / sizeof(testIndexRegs[0]); index++)
		{
			for(unsigned base = 0; base < sizeof(testBaseRegs) / sizeof(testBaseRegs[0]); base++)
			{
				if(testSize & testSizeDword)
				{
					if(testIndexRegs[base] != rNONE || testBaseRegs[base] != rNONE)
					{
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
						stream += fun(stream, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
						stream += fun(stream, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
						stream += fun(stream, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
					}

					if(testIndexRegs[index] != rNONE)
					{
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
						stream += fun(stream, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
						stream += fun(stream, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
						stream += fun(stream, testXmmRegs[xmm], sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
					}
				}

				if(testSize & testSizeQword)
				{
					// skip RDI-based addressing
					if(testIndexRegs[base] != rNONE || testBaseRegs[base] != rNONE)
					{
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
						stream += fun(stream, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
						stream += fun(stream, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
						stream += fun(stream, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024);
					}

					if(testIndexRegs[index] != rNONE)
					{
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
						stream += fun(stream, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
						stream += fun(stream, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4);
						EMIT_OP_REG_RPTR(ctx, op, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
						stream += fun(stream, testXmmRegs[xmm], sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024);
					}
				}
			}
		}
	}

	return int(stream - start);
}